

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar.c
# Opt level: O1

int mtar_write_header(mtar_t *tar,mtar_header_t *h)

{
  uint i;
  int iVar1;
  size_t sVar2;
  long lVar3;
  uint uVar4;
  uint res;
  ulong uVar5;
  mtar_raw_header_t rh;
  byte local_220 [148];
  char local_18c [7];
  undefined1 local_185;
  byte local_184 [356];
  
  if (h->size >> 0x21 == 0) {
    memset(local_220,0,0x200);
    sprintf((char *)(local_220 + 100),"%o",(ulong)h->mode);
    sprintf((char *)(local_220 + 0x6c),"%o",(ulong)h->owner);
    sprintf((char *)(local_220 + 0x7c),"%llo",h->size);
    sprintf((char *)(local_220 + 0x88),"%o",(ulong)h->mtime);
    uVar4 = 0x30;
    if (h->type != 0) {
      uVar4 = h->type;
    }
    local_184[0] = (byte)uVar4;
    sVar2 = strlen(h->name);
    if (sVar2 < 100) {
      sVar2 = strlen(h->linkname);
      if (sVar2 < 100) {
        strcpy((char *)local_220,h->name);
        strcpy((char *)(local_184 + 1),h->linkname);
        uVar5 = 0x100;
        lVar3 = 0;
        do {
          uVar5 = (ulong)((int)uVar5 + (uint)local_220[lVar3]);
          lVar3 = lVar3 + 1;
        } while (lVar3 != 0x94);
        lVar3 = 0x9c;
        do {
          uVar5 = (ulong)((int)uVar5 + (uint)local_220[lVar3]);
          lVar3 = lVar3 + 1;
        } while (lVar3 != 0x200);
        sprintf(local_18c,"%06o",uVar5);
        local_185 = 0x20;
      }
    }
  }
  tar->remaining_data = h->size;
  iVar1 = (*tar->write)(tar,local_220,0x200);
  tar->pos = tar->pos + 0x200;
  return iVar1;
}

Assistant:

int mtar_write_header(mtar_t *tar, const mtar_header_t *h) {
  mtar_raw_header_t rh;
  /* Build raw header and write */
  mtar_header_to_raw(&rh, h);
  tar->remaining_data = h->size;
  return mtar_twrite(tar, &rh, sizeof(rh));
}